

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_srlr_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  ulong uVar1;
  byte bVar2;
  uint64_t r_bit;
  int32_t b_arg2;
  uint64_t u_arg1;
  int64_t arg2_local;
  int64_t arg1_local;
  ulong uStack_10;
  uint32_t df_local;
  
  uStack_10 = arg1 & 0xffffffffffffffffU >> (0x40U - (char)(1L << ((char)df + 3U & 0x3f)) & 0x3f);
  uVar1 = (ulong)arg2 % (ulong)(1L << ((char)df + 3U & 0x3f));
  if ((int)uVar1 != 0) {
    bVar2 = (byte)uVar1;
    uStack_10 = (uStack_10 >> (bVar2 & 0x3f)) + (uStack_10 >> (bVar2 - 1 & 0x3f) & 1);
  }
  return uStack_10;
}

Assistant:

static inline int64_t msa_srlr_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    int32_t b_arg2 = BIT_POSITION(arg2, df);
    if (b_arg2 == 0) {
        return u_arg1;
    } else {
        uint64_t r_bit = (u_arg1 >> (b_arg2 - 1)) & 1;
        return (u_arg1 >> b_arg2) + r_bit;
    }
}